

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_uhsubaddx_arm(uint32_t a,uint32_t b)

{
  return (a & 0xffff) + (b >> 0x10) >> 1 | ((a >> 0x10) - (b & 0xffff) & 0xfffffffe) << 0xf;
}

Assistant:

uint32_t HELPER(glue(PFX,subaddx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b >> 16, 0);
    SUB16(a >> 16, b, 1);
    SET_GE;
    return res;
}